

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O2

ostream * jsonnet::internal::operator<<(ostream *o,Token *v)

{
  string *__lhs;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  
  __lhs = &v->data;
  bVar1 = std::operator==(__lhs,"");
  if (bVar1) {
    pcVar2 = Token::toString(v->kind);
    poVar3 = o;
  }
  else if (v->kind == OPERATOR) {
    poVar3 = std::operator<<(o,"\"");
    poVar3 = std::operator<<(poVar3,(string *)__lhs);
    pcVar2 = "\"";
  }
  else {
    poVar3 = std::operator<<(o,"(");
    pcVar2 = Token::toString(v->kind);
    poVar3 = std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<(poVar3,", \"");
    poVar3 = std::operator<<(poVar3,(string *)__lhs);
    pcVar2 = "\")";
  }
  std::operator<<(poVar3,pcVar2);
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const Token &v)
{
    if (v.data == "") {
        o << Token::toString(v.kind);
    } else if (v.kind == Token::OPERATOR) {
        o << "\"" << v.data << "\"";
    } else {
        o << "(" << Token::toString(v.kind) << ", \"" << v.data << "\")";
    }
    return o;
}